

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BasicCopyTexImage2DCase::createTexture(BasicCopyTexImage2DCase *this)

{
  ContextWrapper *this_00;
  ChannelOrder CVar1;
  uint uVar2;
  int iVar3;
  deUint32 seed;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Context *pCVar7;
  NotSupportedError *this_01;
  uint uVar8;
  int width;
  uint uVar9;
  int height;
  int ndx;
  int local_1c8;
  deUint32 tex;
  deUint32 local_1c0;
  uint local_1bc;
  Random rnd;
  Vec3 local_1a8;
  Vec3 local_198;
  GradientShader shader;
  long lVar6;
  
  iVar3 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_1bc = 0;
  if ((0 < *(int *)(lVar6 + 8)) && (0 < *(int *)(lVar6 + 0xc))) {
    local_1bc = (uint)(0 < *(int *)(lVar6 + 0x10));
  }
  CVar1 = (this->super_TextureSpecCase).m_texFormat.order;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_1c8 = 1;
  }
  else {
    uVar2 = (this->super_TextureSpecCase).m_width;
    uVar8 = 0x20;
    uVar9 = uVar8;
    if (uVar2 != 0) {
      uVar9 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = uVar9 ^ 0x1f;
    }
    uVar2 = (this->super_TextureSpecCase).m_height;
    if (uVar2 != 0) {
      uVar8 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = uVar8 ^ 0x1f;
    }
    local_1c8 = 0x1f - uVar8;
    if ((int)(0x1f - uVar8) < (int)(0x1f - uVar9)) {
      local_1c8 = 0x1f - uVar9;
    }
    local_1c8 = local_1c8 + 1;
  }
  iVar3 = *(int *)(lVar6 + 0x14);
  tex = 0;
  seed = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                      m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  GradientShader::GradientShader(&shader);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1c0 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&shader);
  if ((CVar1 == A || (local_1bc & 1) != 0) &&
     ((RGBA < CVar1 || (0xedU >> ((byte)CVar1 & 0x1f) & 1) != 0) || 0 < iVar3)) {
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_198.m_data[0] = -1.0;
    local_198.m_data[1] = -1.0;
    local_198.m_data[2] = 0.0;
    local_1a8.m_data[0] = 1.0;
    local_1a8.m_data[1] = 1.0;
    local_1a8.m_data[2] = 0.0;
    sglr::drawQuad(pCVar7,local_1c0,&local_198,&local_1a8);
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
    for (iVar3 = 0; local_1c8 != iVar3; iVar3 = iVar3 + 1) {
      width = (this->super_TextureSpecCase).m_width >> ((byte)iVar3 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (this->super_TextureSpecCase).m_height >> ((byte)iVar3 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      iVar4 = sglr::ContextWrapper::getWidth(this_00);
      iVar4 = de::Random::getInt(&rnd,0,iVar4 - width);
      iVar5 = sglr::ContextWrapper::getHeight(this_00);
      iVar5 = de::Random::getInt(&rnd,0,iVar5 - height);
      sglr::ContextWrapper::glCopyTexImage2D
                (this_00,0xde1,iVar3,this->m_internalFormat,iVar4,iVar5,width,height,0);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x509);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		x			= rnd.getInt(0, getWidth()	- levelW);
			int		y			= rnd.getInt(0, getHeight()	- levelH);

			glCopyTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, x, y, levelW, levelH, 0);
		}
	}